

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindCopy
          (ClientContext *context,CopyInfo *info,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expected_names,vector<duckdb::LogicalType,_true> *expected_types)

{
  case_insensitive_map_t<Value> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  bool bVar4;
  type file_options;
  pointer pMVar5;
  NotImplementedException *this_00;
  pointer pbVar6;
  vector<duckdb::LogicalType,_true> *in_R8;
  vector<duckdb::LogicalType,_true> *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_209;
  undefined1 local_208 [24];
  _Alloc_hider local_1f0;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  undefined1 local_1d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  paths;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  MultiFileOptions local_160;
  MultiFileOptions local_c8;
  
  local_198._M_allocated_capacity = (size_type)in_R8;
  local_198._8_8_ = expected_types;
  local_188._M_head_impl = (FunctionData *)context;
  ParquetMultiFileInfo::InitializeOptions
            ((ClientContext *)local_208,(optional_ptr<duckdb::TableFunctionInfo,_true>)info);
  local_160.hive_types_schema._M_h._M_buckets = &local_160.hive_types_schema._M_h._M_single_bucket;
  local_160.filename = false;
  local_160.hive_partitioning = false;
  local_160.auto_detect_hive_partitioning = true;
  local_160.union_by_name = false;
  local_160.hive_types_autocast = true;
  local_160.mapping = BY_NAME;
  local_160.hive_types_schema._M_h._M_bucket_count = 1;
  local_160.hive_types_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160.hive_types_schema._M_h._M_element_count = 0;
  local_160.hive_types_schema._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_160.hive_types_schema._M_h._M_rehash_policy._M_next_resize = 0;
  local_160.hive_types_schema._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_160.filename_column._M_dataplus._M_p = (pointer)&local_160.filename_column.field_2;
  local_160.filename_column.field_2._M_allocated_capacity = 0x656d616e656c6966;
  local_160.filename_column._M_string_length = 8;
  local_160.filename_column.field_2._8_4_ = local_160.filename_column.field_2._8_4_ & 0xffffff00;
  local_160.custom_options._M_h._M_buckets = &local_160.custom_options._M_h._M_single_bucket;
  local_160.custom_options._M_h._M_bucket_count = 1;
  local_160.custom_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160.custom_options._M_h._M_element_count = 0;
  local_160.custom_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_160.custom_options._M_h._M_rehash_policy._M_next_resize = 0;
  local_160.custom_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pbVar6 = expected_names[9].
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != (pointer)0x0) {
    do {
      StringUtil::Lower((string *)&file_list,(string *)&pbVar6->_M_string_length);
      file_options = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                     ::operator*((unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                                  *)local_208);
      bVar4 = ParquetMultiFileInfo::ParseCopyOption
                        ((ClientContext *)info,(string *)&file_list,
                         (vector<duckdb::Value,_true> *)&pbVar6[1]._M_string_length,file_options,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)in_R8,in_R9);
      if (!bVar4) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        paths.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&paths.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&paths,"Unsupported option for COPY FROM: %s","");
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,pbVar6->_M_string_length,
                   (pbVar6->field_2)._M_allocated_capacity + pbVar6->_M_string_length);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_00,(string *)&paths,&local_180);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_1d8) {
        operator_delete(file_list.internal.
                        super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
      }
      pbVar6 = (pointer)(pbVar6->_M_dataplus)._M_p;
    } while (pbVar6 != (pointer)0x0);
  }
  unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
  ::operator*((unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
               *)local_208);
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&file_list,"COPY","");
  MultiFileReader::CreateDefault((MultiFileReader *)(local_208 + 0x10),(string *)&file_list);
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_1d8) {
    operator_delete(file_list.internal.
                    super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pbVar6 = expected_names[7].
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1d8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&file_list,pbVar6,
             (long)&((expected_names[7].
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p +
             (long)pbVar6);
  __l._M_len = 1;
  __l._M_array = (iterator)&file_list;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&paths,__l,&local_209);
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_1d8) {
    operator_delete(file_list.internal.
                    super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pMVar5 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)(local_208 + 0x10));
  (*pMVar5->_vptr_MultiFileReader[3])(&file_list,pMVar5,info,&paths,0);
  this = &local_160.custom_options;
  local_208._8_8_ = local_208._16_8_;
  local_208._16_8_ = (element_type *)0x0;
  local_1a8._M_allocated_capacity =
       (size_type)
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1a8._8_8_ =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.filename = local_160.filename;
  local_c8.hive_partitioning = local_160.hive_partitioning;
  local_c8.auto_detect_hive_partitioning = local_160.auto_detect_hive_partitioning;
  local_c8.union_by_name = local_160.union_by_name;
  local_c8.hive_types_autocast = local_160.hive_types_autocast;
  local_c8.mapping = local_160.mapping;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.hive_types_schema._M_h,&local_160.hive_types_schema);
  paVar1 = &local_c8.filename_column.field_2;
  paVar2 = &local_160.filename_column.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename_column._M_dataplus._M_p == paVar2) {
    local_c8.filename_column.field_2._8_4_ = local_160.filename_column.field_2._8_4_;
    local_c8.filename_column.field_2._12_4_ = local_160.filename_column.field_2._12_4_;
    local_c8.filename_column._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.filename_column._M_dataplus._M_p = local_160.filename_column._M_dataplus._M_p;
  }
  local_c8.filename_column.field_2._M_allocated_capacity =
       local_160.filename_column.field_2._M_allocated_capacity;
  local_c8.filename_column._M_string_length = local_160.filename_column._M_string_length;
  local_160.filename_column._M_string_length = 0;
  local_160.filename_column.field_2._M_allocated_capacity =
       local_160.filename_column.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_160.filename_column._M_dataplus._M_p = (pointer)paVar2;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.custom_options._M_h,this,this);
  _Var3._M_head_impl = local_188._M_head_impl;
  local_1f0._M_p = (pointer)local_208._0_8_;
  local_208._0_8_ =
       (__uniq_ptr_data<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true,_true>
        )0x0;
  MultiFileBindInternal
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)local_188._M_head_impl,
             (ClientContext *)info,
             (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
              *)(local_208 + 8),(shared_ptr<duckdb::MultiFileList,_true> *)&local_1a8,
             (vector<duckdb::LogicalType,_true> *)local_198._M_allocated_capacity,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)local_198._8_8_,&local_c8,
             (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
              *)&local_1f0);
  if ((element_type *)local_1f0._M_p != (element_type *)0x0) {
    (**(code **)(*(long *)local_1f0._M_p + 8))();
  }
  local_1f0._M_p = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.filename_column._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.hive_types_schema._M_h);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_208._8_8_)[1])();
  }
  local_208._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&paths);
  if ((element_type *)local_208._16_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)local_208._16_8_)->
                __weak_this_).internal.
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)();
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename_column._M_dataplus._M_p != &local_160.filename_column.field_2) {
    operator_delete(local_160.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_160.hive_types_schema._M_h);
  if ((tuple<duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>)
      local_208._0_8_ != (_Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>)0x0) {
    (**(code **)(*(long *)local_208._0_8_ + 8))();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var3._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> MultiFileBindCopy(ClientContext &context, CopyInfo &info,
	                                                  vector<string> &expected_names,
	                                                  vector<LogicalType> &expected_types) {
		auto options = OP::InitializeOptions(context, nullptr);
		MultiFileOptions file_options;

		for (auto &option : info.options) {
			auto loption = StringUtil::Lower(option.first);
			if (OP::ParseCopyOption(context, loption, option.second, *options, expected_names, expected_types)) {
				continue;
			}
			throw NotImplementedException("Unsupported option for COPY FROM: %s", option.first);
		}
		OP::FinalizeCopyBind(context, *options, expected_names, expected_types);

		// TODO: Allow overriding the MultiFileReader for COPY FROM?
		auto multi_file_reader = MultiFileReader::CreateDefault("COPY");
		vector<string> paths = {info.file_path};
		auto file_list = multi_file_reader->CreateFileList(context, paths);

		return MultiFileBindInternal(context, std::move(multi_file_reader), std::move(file_list), expected_types,
		                             expected_names, std::move(file_options), std::move(options));
	}